

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::FboCases::BlendTest::render(BlendTest *this,Context *context,Surface *dst)

{
  undefined8 uVar1;
  deUint32 program;
  deUint32 dVar2;
  uint uVar3;
  uint uVar4;
  FboConfig *pFVar5;
  Vector<float,_3> local_1f8;
  Vector<float,_3> local_1ec;
  Vector<float,_3> local_1e0;
  Vector<float,_3> local_1d4;
  undefined1 local_1c8 [8];
  Framebuffer fbo;
  deUint32 metaballsTex;
  int height;
  int width;
  undefined1 local_178 [4];
  deUint32 shaderID;
  SingleTex2DShader shader;
  Surface *dst_local;
  Context *context_local;
  BlendTest *this_local;
  
  shader.super_ShaderProgram._336_8_ = dst;
  SingleTex2DShader::SingleTex2DShader((SingleTex2DShader *)local_178);
  program = (*context->_vptr_Context[0x75])(context,(SingleTex2DShader *)local_178);
  uVar3 = this->m_fboWidth;
  fbo.m_stencilbuffer = this->m_fboHeight;
  fbo.m_depthbuffer = 1;
  createMetaballsTex2D(context,1,0x1908,0x1401,0x40,0x40);
  pFVar5 = FboRenderCase::getConfig(&this->super_FboRenderCase);
  Functional::Framebuffer::Framebuffer
            ((Framebuffer *)local_1c8,context,pFVar5,uVar3,fbo.m_stencilbuffer,0,0,0,0);
  Functional::Framebuffer::checkCompleteness((Framebuffer *)local_1c8);
  SingleTex2DShader::setUnit((SingleTex2DShader *)local_178,context,program,0);
  dVar2 = Functional::Framebuffer::getFramebuffer((Framebuffer *)local_1c8);
  (*context->_vptr_Context[9])(context,0x8d40,(ulong)dVar2);
  (*context->_vptr_Context[5])(context,0,0,(ulong)uVar3,(ulong)fbo.m_stencilbuffer);
  (*context->_vptr_Context[6])(context,0xde1,(ulong)fbo.m_depthbuffer);
  (*context->_vptr_Context[0x2a])(0x3f19999a,0,0x3f19999a,0x3f800000);
  (*context->_vptr_Context[0x2d])(context,0x4500);
  (*context->_vptr_Context[0x33])(context,0xbe2);
  (*context->_vptr_Context[0x3f])(context,0x8006);
  (*context->_vptr_Context[0x42])(context,0x302,0x303,0,1);
  tcu::Vector<float,_3>::Vector(&local_1d4,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector(&local_1e0,1.0,1.0,0.0);
  sglr::drawQuad(context,program,&local_1d4,&local_1e0);
  (*context->_vptr_Context[0x34])(context,0xbe2);
  pFVar5 = Functional::Framebuffer::getConfig((Framebuffer *)local_1c8);
  if (pFVar5->colorbufferType == 0xde1) {
    (*context->_vptr_Context[9])(context,0x8d40,0);
    dVar2 = Functional::Framebuffer::getColorbuffer((Framebuffer *)local_1c8);
    (*context->_vptr_Context[6])(context,0xde1,(ulong)dVar2);
    uVar3 = (*context->_vptr_Context[2])();
    uVar4 = (*context->_vptr_Context[3])();
    (*context->_vptr_Context[5])(context,0,0,(ulong)uVar3,(ulong)uVar4);
    tcu::Vector<float,_3>::Vector(&local_1ec,-1.0,-1.0,0.0);
    tcu::Vector<float,_3>::Vector(&local_1f8,1.0,1.0,0.0);
    sglr::drawQuad(context,program,&local_1ec,&local_1f8);
    uVar1 = shader.super_ShaderProgram._336_8_;
    uVar3 = (*context->_vptr_Context[2])();
    uVar4 = (*context->_vptr_Context[3])();
    (*context->_vptr_Context[0x80])(context,uVar1,0,0,(ulong)uVar3,(ulong)uVar4);
  }
  else {
    (*context->_vptr_Context[0x80])
              (context,shader.super_ShaderProgram._336_8_,0,0,(ulong)uVar3,
               (ulong)fbo.m_stencilbuffer);
  }
  Functional::Framebuffer::~Framebuffer((Framebuffer *)local_1c8);
  SingleTex2DShader::~SingleTex2DShader((SingleTex2DShader *)local_178);
  return;
}

Assistant:

void BlendTest::render (sglr::Context& context, Surface& dst)
{
	SingleTex2DShader	shader;
	deUint32			shaderID		= context.createProgram(&shader);
	int					width			= m_fboWidth;
	int					height			= m_fboHeight;
	deUint32			metaballsTex	= 1;

	createMetaballsTex2D(context, metaballsTex, GL_RGBA, GL_UNSIGNED_BYTE, 64, 64);

	Framebuffer fbo(context, getConfig(), width, height);
	fbo.checkCompleteness();

	shader.setUnit(context, shaderID, 0);

	context.bindFramebuffer(GL_FRAMEBUFFER, fbo.getFramebuffer());
	context.viewport(0, 0, width, height);
	context.bindTexture(GL_TEXTURE_2D, metaballsTex);
	context.clearColor(0.6f, 0.0f, 0.6f, 1.0f);
	context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	context.enable(GL_BLEND);
	context.blendEquation(GL_FUNC_ADD);
	context.blendFuncSeparate(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA, GL_ZERO, GL_ONE);
	sglr::drawQuad(context, shaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
	context.disable(GL_BLEND);

	if (fbo.getConfig().colorbufferType == GL_TEXTURE_2D)
	{
		context.bindFramebuffer(GL_FRAMEBUFFER, 0);
		context.bindTexture(GL_TEXTURE_2D, fbo.getColorbuffer());
		context.viewport(0, 0, context.getWidth(), context.getHeight());
		sglr::drawQuad(context, shaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		context.readPixels(dst, 0, 0, context.getWidth(), context.getHeight());
	}
	else
		context.readPixels(dst, 0, 0, width, height);
}